

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  Item *pIVar5;
  pointer pnVar6;
  undefined8 uVar7;
  int32_t iVar8;
  long lVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar15;
  pointer pnVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_160;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_148;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> *local_d0;
  cpp_dec_float<50U,_int,_void> local_c8;
  cpp_dec_float<50U,_int,_void> local_88;
  cpp_dec_float<50U,_int,_void> *local_50;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  long local_40;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems._24_5_ = 0;
  local_88.data._M_elems[7]._1_3_ = 0;
  local_88.data._M_elems._32_5_ = 0;
  local_88.data._M_elems[9]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar3 = pSVar2->thePvec;
  pUVar4 = pSVar2->theCoPvec;
  iVar12 = (id->super_DataKey).info * pSVar2->theRep;
  if (iVar12 < 0) {
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[nr]) {
      this_00 = &pUVar4->thedelta;
      goto LAB_002dd7fc;
    }
    pVVar18 = pSVar2->theCoUbound;
    local_160 = pSVar2->theCoLbound;
    pnVar16 = (pUVar4->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_108.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar16 + nr) + 0x20),0);
    local_108.data._M_elems[9]._1_3_ =
         (undefined3)((ulong)*(undefined8 *)((long)(pnVar16 + nr) + 0x20) >> 0x28);
    local_108.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[nr].m_backend;
    local_108.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[nr].m_backend + 8);
    local_108.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar16 + nr) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar16 + nr) + 0x18);
    local_108.data._M_elems._24_5_ = SUB85(uVar11,0);
    local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
    local_108.exp = *(int *)((long)(pnVar16 + nr) + 0x28);
    local_108.neg = *(bool *)((long)(pnVar16 + nr) + 0x2c);
    local_108._48_8_ = *(undefined8 *)((long)(pnVar16 + nr) + 0x30);
    pnVar16 = (pUVar4->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_88.exp = pnVar16[nr].m_backend.exp;
    local_88.neg = pnVar16[nr].m_backend.neg;
    local_88.fpclass = pnVar16[nr].m_backend.fpclass;
    local_88.prec_elem = pnVar16[nr].m_backend.prec_elem;
    local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[nr].m_backend.data;
    local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[nr].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar16[nr].m_backend.data + 0x10);
    local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    uVar11 = *(undefined8 *)((long)&pnVar16[nr].m_backend.data + 0x20);
    local_88.data._M_elems._32_5_ = SUB85(uVar11,0);
    local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
    local_88.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_d0 = &sel->m_backend;
    local_50 = &maxabs->m_backend;
    if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_002dda7d:
      pnVar16 = (pVVar18->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_c8.fpclass = cpp_dec_float_finite;
      local_c8.prec_elem = 10;
      local_c8.data._M_elems[0] = 0;
      local_c8.data._M_elems[1] = 0;
      local_c8.data._M_elems[2] = 0;
      local_c8.data._M_elems[3] = 0;
      local_c8.data._M_elems[4] = 0;
      local_c8.data._M_elems[5] = 0;
      local_c8.data._M_elems._24_5_ = 0;
      local_c8.data._M_elems[7]._1_3_ = 0;
      local_c8.data._M_elems._32_5_ = 0;
      local_c8.data._M_elems[9]._1_3_ = 0;
      local_c8.exp = 0;
      local_c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_c8,0.0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_88,&local_c8);
      if (-1 < iVar12) goto LAB_002dda7d;
      pnVar16 = (local_160->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(pnVar16 + nr);
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar4->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    local_148.val.m_backend.fpclass = cpp_dec_float_finite;
    local_148.val.m_backend.prec_elem = 10;
    local_148.val.m_backend.data._M_elems[0] = 0;
    local_148.val.m_backend.data._M_elems[1] = 0;
    local_148.val.m_backend.data._M_elems[2] = 0;
    local_148.val.m_backend.data._M_elems[3] = 0;
    local_148.val.m_backend.data._M_elems[4] = 0;
    local_148.val.m_backend.data._M_elems[5] = 0;
    local_148.val.m_backend.data._M_elems._24_5_ = 0;
    local_148.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_148.val.m_backend.data._M_elems._32_5_ = 0;
    local_148.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_148.val.m_backend.exp = 0;
    local_148.val.m_backend.neg = false;
    if (&local_148 == pNVar17) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_148,
                 (cpp_dec_float<50U,_int,_void> *)pNVar15);
      if (local_148.val.m_backend.data._M_elems[0] != 0 ||
          local_148.val.m_backend.fpclass != cpp_dec_float_finite) {
        local_148.val.m_backend.neg = (bool)(local_148.val.m_backend.neg ^ 1);
      }
    }
    else {
      if (&local_148 != pNVar15) {
        uVar11 = *(undefined8 *)((long)(pNVar15->val).m_backend.data._M_elems + 0x20);
        local_148.val.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
        local_148.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        local_148.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar15->val).m_backend.data._M_elems;
        local_148.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar15->val).m_backend.data._M_elems + 8);
        local_148.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar15->val).m_backend.data._M_elems + 0x10);
        uVar11 = *(undefined8 *)((long)(pNVar15->val).m_backend.data._M_elems + 0x18);
        local_148.val.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
        local_148.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        local_148.val.m_backend.exp = *(int *)((long)&(pNVar15->val).m_backend + 0x28);
        local_148.val.m_backend.neg = *(bool *)((long)&(pNVar15->val).m_backend + 0x2c);
        local_148.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar15->val).m_backend + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_148,
                 (cpp_dec_float<50U,_int,_void> *)pNVar17);
    }
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems._24_5_ = 0;
    local_c8.data._M_elems[7]._1_3_ = 0;
    local_c8.data._M_elems._32_5_ = 0;
    local_c8.data._M_elems[9]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_c8,(cpp_dec_float<50U,_int,_void> *)&local_148,&local_88);
    uVar11 = CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
    pcVar14 = local_d0;
    goto LAB_002ddc5a;
  }
  if (iVar12 == 0) {
    return true;
  }
  pVVar18 = pSVar2->theUbound;
  local_160 = pSVar2->theLbound;
  pIVar5 = (pSVar2->thevectors->set).theitem;
  local_40 = (long)nr;
  iVar12 = (pSVar2->thevectors->set).thekey[local_40].idx;
  local_c8.fpclass = cpp_dec_float_finite;
  local_c8.prec_elem = 10;
  local_c8.data._M_elems[0] = 0;
  local_c8.data._M_elems[1] = 0;
  local_c8.data._M_elems[2] = 0;
  local_c8.data._M_elems[3] = 0;
  local_c8.data._M_elems[4] = 0;
  local_c8.data._M_elems[5] = 0;
  local_c8.data._M_elems._24_5_ = 0;
  local_c8.data._M_elems[7]._1_3_ = 0;
  local_c8.data._M_elems._32_5_ = 0;
  local_c8.data._M_elems[9]._1_3_ = 0;
  local_c8.exp = 0;
  local_c8.neg = false;
  iVar13 = pIVar5[iVar12].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  local_d0 = &sel->m_backend;
  local_50 = &maxabs->m_backend;
  local_48 = &pUVar3->thedelta;
  local_38 = this;
  if (0 < iVar13) {
    pNVar17 = pIVar5[iVar12].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar13 = iVar13 + 1;
    do {
      pNVar10 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pUVar4->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + pNVar17->idx);
      local_148.val.m_backend.fpclass = cpp_dec_float_finite;
      local_148.val.m_backend.prec_elem = 10;
      local_148.val.m_backend.data._M_elems[0] = 0;
      local_148.val.m_backend.data._M_elems[1] = 0;
      local_148.val.m_backend.data._M_elems[2] = 0;
      local_148.val.m_backend.data._M_elems[3] = 0;
      local_148.val.m_backend.data._M_elems[4] = 0;
      local_148.val.m_backend.data._M_elems[5] = 0;
      local_148.val.m_backend.data._M_elems._24_5_ = 0;
      local_148.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_148.val.m_backend.data._M_elems._32_5_ = 0;
      local_148.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_148.val.m_backend.exp = 0;
      local_148.val.m_backend.neg = false;
      pNVar15 = pNVar17;
      if ((&local_148 != pNVar10) && (pNVar15 = pNVar10, pNVar17 != &local_148)) {
        uVar11 = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 8);
        local_148.val.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
        local_148.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        local_148.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar17->val).m_backend.data._M_elems;
        local_148.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 2);
        local_148.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 4);
        uVar11 = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 6);
        local_148.val.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
        local_148.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        local_148.val.m_backend.exp = (pNVar17->val).m_backend.exp;
        local_148.val.m_backend.neg = (pNVar17->val).m_backend.neg;
        local_148.val.m_backend.fpclass = (pNVar17->val).m_backend.fpclass;
        local_148.val.m_backend.prec_elem = (pNVar17->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)&local_148,
                 (cpp_dec_float<50U,_int,_void> *)pNVar15);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_c8,(cpp_dec_float<50U,_int,_void> *)&local_148);
      pNVar17 = pNVar17 + 1;
      iVar13 = iVar13 + -1;
    } while (1 < iVar13);
  }
  this = local_38;
  lVar9 = local_40;
  local_148.val.m_backend.data._M_elems._32_5_ = local_c8.data._M_elems._32_5_;
  local_148.val.m_backend.data._M_elems[9]._1_3_ = local_c8.data._M_elems[9]._1_3_;
  local_148.val.m_backend.data._M_elems[4] = local_c8.data._M_elems[4];
  local_148.val.m_backend.data._M_elems[5] = local_c8.data._M_elems[5];
  local_148.val.m_backend.data._M_elems._24_5_ = local_c8.data._M_elems._24_5_;
  local_148.val.m_backend.data._M_elems[7]._1_3_ = local_c8.data._M_elems[7]._1_3_;
  local_148.val.m_backend.data._M_elems[0] = local_c8.data._M_elems[0];
  local_148.val.m_backend.data._M_elems[1] = local_c8.data._M_elems[1];
  local_148.val.m_backend.data._M_elems[2] = local_c8.data._M_elems[2];
  local_148.val.m_backend.data._M_elems[3] = local_c8.data._M_elems[3];
  pnVar16 = (pUVar3->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)(pnVar16 + local_40) + 0x20) =
       CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
  *(undefined8 *)((long)(pnVar16 + local_40) + 0x10) = local_c8.data._M_elems._16_8_;
  *(ulong *)((long)(pnVar16 + local_40) + 0x18) =
       CONCAT35(local_c8.data._M_elems[7]._1_3_,local_c8.data._M_elems._24_5_);
  *(undefined8 *)&pnVar16[local_40].m_backend = local_c8.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar16[local_40].m_backend + 8) = local_c8.data._M_elems._8_8_;
  *(int *)((long)(pnVar16 + local_40) + 0x28) = local_c8.exp;
  *(bool *)((long)(pnVar16 + local_40) + 0x2c) = local_c8.neg;
  *(undefined8 *)((long)(pnVar16 + local_40) + 0x30) = local_c8._48_8_;
  pSVar2 = (local_38->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = local_48;
  if (0 < pSVar2->theRep *
          ((pSVar2->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[local_40]) {
LAB_002dd7fc:
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar16 = (pUVar3->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_108.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar16 + local_40) + 0x20),0);
  local_108.data._M_elems[9]._1_3_ =
       (undefined3)((ulong)*(undefined8 *)((long)(pnVar16 + local_40) + 0x20) >> 0x28);
  local_108.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[local_40].m_backend;
  local_108.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[local_40].m_backend + 8);
  local_108.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar16 + local_40) + 0x10);
  uVar11 = *(undefined8 *)((long)(pnVar16 + local_40) + 0x18);
  local_108.data._M_elems._24_5_ = SUB85(uVar11,0);
  local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
  local_108.exp = *(int *)((long)(pnVar16 + local_40) + 0x28);
  local_108.neg = *(bool *)((long)(pnVar16 + local_40) + 0x2c);
  local_108._48_8_ = *(undefined8 *)((long)(pnVar16 + local_40) + 0x30);
  pnVar16 = (pUVar3->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_88.exp = pnVar16[local_40].m_backend.exp;
  local_88.neg = pnVar16[local_40].m_backend.neg;
  local_88.fpclass = pnVar16[local_40].m_backend.fpclass;
  local_88.prec_elem = pnVar16[local_40].m_backend.prec_elem;
  local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[local_40].m_backend.data;
  local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[local_40].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar16[local_40].m_backend.data + 0x10);
  local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 2);
  uVar11 = *(undefined8 *)((long)&pnVar16[local_40].m_backend.data + 0x20);
  local_88.data._M_elems._32_5_ = SUB85(uVar11,0);
  local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
  local_88.data._M_elems._24_5_ = SUB85(uVar7,0);
  local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_002dd8ef:
    pcVar14 = local_d0;
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pVVar18->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9);
    pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9);
    local_148.val.m_backend.fpclass = cpp_dec_float_finite;
    local_148.val.m_backend.prec_elem = 10;
    local_148.val.m_backend.data._M_elems[0] = 0;
    local_148.val.m_backend.data._M_elems[1] = 0;
    local_148.val.m_backend.data._M_elems[2] = 0;
    local_148.val.m_backend.data._M_elems[3] = 0;
    local_148.val.m_backend.data._M_elems[4] = 0;
    local_148.val.m_backend.data._M_elems[5] = 0;
    local_148.val.m_backend.data._M_elems._24_5_ = 0;
    local_148.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_148.val.m_backend.data._M_elems._32_5_ = 0;
    local_148.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_148.val.m_backend.exp = 0;
    local_148.val.m_backend.neg = false;
    if (&local_148 == pNVar15) {
LAB_002ddbe3:
      pcVar14 = local_d0;
      local_148.val.m_backend.fpclass = cpp_dec_float_finite;
      local_148.val.m_backend.prec_elem = 10;
      local_148.val.m_backend.neg = false;
      local_148.val.m_backend.exp = 0;
      local_148.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_148.val.m_backend.data._M_elems._32_5_ = 0;
      local_148.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_148.val.m_backend.data._M_elems._24_5_ = 0;
      local_148.val.m_backend.data._M_elems[4] = 0;
      local_148.val.m_backend.data._M_elems[5] = 0;
      local_148.val.m_backend.data._M_elems[2] = 0;
      local_148.val.m_backend.data._M_elems[3] = 0;
      local_148.val.m_backend.data._M_elems[0] = 0;
      local_148.val.m_backend.data._M_elems[1] = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_148,
                 (cpp_dec_float<50U,_int,_void> *)pNVar17);
      if (local_148.val.m_backend.data._M_elems[0] != 0 ||
          local_148.val.m_backend.fpclass != cpp_dec_float_finite) {
        local_148.val.m_backend.neg = (bool)(local_148.val.m_backend.neg ^ 1);
      }
    }
    else {
      if (&local_148 != pNVar17) {
        uVar11 = *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 0x20);
        local_148.val.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
        local_148.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        local_148.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar17->val).m_backend.data._M_elems;
        local_148.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 8);
        local_148.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 0x10);
        uVar11 = *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 0x18);
        local_148.val.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
        local_148.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        local_148.val.m_backend.exp = *(int *)((long)&(pNVar17->val).m_backend + 0x28);
        local_148.val.m_backend.neg = *(bool *)((long)&(pNVar17->val).m_backend + 0x2c);
        local_148.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar17->val).m_backend + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_148,
                 (cpp_dec_float<50U,_int,_void> *)pNVar15);
    }
  }
  else {
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems._24_5_ = 0;
    local_c8.data._M_elems[7]._1_3_ = 0;
    local_c8.data._M_elems._32_5_ = 0;
    local_c8.data._M_elems[9]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_c8,0.0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_88,&local_c8);
    pcVar14 = local_d0;
    if (-1 < iVar12) goto LAB_002dd8ef;
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((local_160->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9);
    pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9);
    local_148.val.m_backend.fpclass = cpp_dec_float_finite;
    local_148.val.m_backend.prec_elem = 10;
    local_148.val.m_backend.data._M_elems[0] = 0;
    local_148.val.m_backend.data._M_elems[1] = 0;
    local_148.val.m_backend.data._M_elems[2] = 0;
    local_148.val.m_backend.data._M_elems[3] = 0;
    local_148.val.m_backend.data._M_elems[4] = 0;
    local_148.val.m_backend.data._M_elems[5] = 0;
    local_148.val.m_backend.data._M_elems._24_5_ = 0;
    local_148.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_148.val.m_backend.data._M_elems._32_5_ = 0;
    local_148.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_148.val.m_backend.exp = 0;
    local_148.val.m_backend.neg = false;
    if (&local_148 == pNVar15) goto LAB_002ddbe3;
    if (&local_148 != pNVar17) {
      uVar11 = *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 0x20);
      local_148.val.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
      local_148.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
      local_148.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(pNVar17->val).m_backend.data._M_elems;
      local_148.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 8);
      local_148.val.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 0x10);
      uVar11 = *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + 0x18);
      local_148.val.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
      local_148.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
      local_148.val.m_backend.exp = *(int *)((long)&(pNVar17->val).m_backend + 0x28);
      local_148.val.m_backend.neg = *(bool *)((long)&(pNVar17->val).m_backend + 0x2c);
      local_148.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar17->val).m_backend + 0x30);
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)&local_148,(cpp_dec_float<50U,_int,_void> *)pNVar15)
    ;
  }
  local_c8.fpclass = cpp_dec_float_finite;
  local_c8.prec_elem = 10;
  local_c8.data._M_elems[0] = 0;
  local_c8.data._M_elems[1] = 0;
  local_c8.data._M_elems[2] = 0;
  local_c8.data._M_elems[3] = 0;
  local_c8.data._M_elems[4] = 0;
  local_c8.data._M_elems[5] = 0;
  local_c8.data._M_elems._24_5_ = 0;
  local_c8.data._M_elems[7]._1_3_ = 0;
  local_c8.data._M_elems._32_5_ = 0;
  local_c8.data._M_elems[9]._1_3_ = 0;
  local_c8.exp = 0;
  local_c8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_c8,(cpp_dec_float<50U,_int,_void> *)&local_148,&local_88);
  uVar11 = CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
LAB_002ddc5a:
  *(undefined8 *)((pcVar14->data)._M_elems + 8) = uVar11;
  *(undefined8 *)((pcVar14->data)._M_elems + 4) = local_c8.data._M_elems._16_8_;
  *(ulong *)((pcVar14->data)._M_elems + 6) =
       CONCAT35(local_c8.data._M_elems[7]._1_3_,local_c8.data._M_elems._24_5_);
  *(undefined8 *)(pcVar14->data)._M_elems = local_c8.data._M_elems._0_8_;
  *(undefined8 *)((pcVar14->data)._M_elems + 2) = local_c8.data._M_elems._8_8_;
  pcVar14->exp = local_c8.exp;
  pcVar14->neg = local_c8.neg;
  pcVar14->fpclass = local_c8.fpclass;
  pcVar14->prec_elem = local_c8.prec_elem;
  pnVar16 = (pVVar18->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar16[nr].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar6 = (local_160->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pnVar6[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&pnVar16[nr].m_backend,&pnVar6[nr].m_backend), iVar12 != 0)) {
    uVar11 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 8);
    local_148.val.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
    local_148.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
    local_148.val.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(this->fastDelta).m_backend.data._M_elems;
    local_148.val.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 2);
    local_148.val.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 4);
    uVar11 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 6);
    local_148.val.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
    local_148.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
    local_148.val.m_backend.exp = (this->fastDelta).m_backend.exp;
    local_148.val.m_backend.neg = (this->fastDelta).m_backend.neg;
    local_148.val.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
    local_148.val.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_148.val.m_backend.fpclass != cpp_dec_float_finite ||
        local_148.val.m_backend.data._M_elems[0] != 0) {
      local_148.val.m_backend.neg = (bool)(local_148.val.m_backend.neg ^ 1);
    }
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems._24_5_ = 0;
    local_c8.data._M_elems[7]._1_3_ = 0;
    local_c8.data._M_elems._32_5_ = 0;
    local_c8.data._M_elems[9]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_c8,(cpp_dec_float<50U,_int,_void> *)&local_148,local_50);
    if (((pcVar14->fpclass != cpp_dec_float_NaN) && (local_c8.fpclass != cpp_dec_float_NaN)) &&
       ((iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar14,&local_c8), iVar12 < 0 &&
        (boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                   ((cpp_dec_float<50u,int,void> *)pcVar14,0.0), !polish)))) {
      if (local_88.fpclass != cpp_dec_float_NaN) {
        local_c8.fpclass = cpp_dec_float_finite;
        local_c8.prec_elem = 10;
        local_c8.data._M_elems[0] = 0;
        local_c8.data._M_elems[1] = 0;
        local_c8.data._M_elems[2] = 0;
        local_c8.data._M_elems[3] = 0;
        local_c8.data._M_elems[4] = 0;
        local_c8.data._M_elems[5] = 0;
        local_c8.data._M_elems._24_5_ = 0;
        local_c8.data._M_elems[7]._1_3_ = 0;
        local_c8.data._M_elems._32_5_ = 0;
        local_c8.data._M_elems[9]._1_3_ = 0;
        local_c8.exp = 0;
        local_c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_c8,0.0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_88,&local_c8);
        if (0 < iVar12) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar18->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          pnVar16 = (pVVar18->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar16[nr].m_backend.data = local_108.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar16[nr].m_backend.data + 8) = local_108.data._M_elems._8_8_;
          puVar1 = (uint *)((long)&pnVar16[nr].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_108.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar16[nr].m_backend.data + 0x20) =
               CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_);
          pnVar16[nr].m_backend.exp = local_108.exp;
          pnVar16[nr].m_backend.neg = local_108.neg;
          pnVar16[nr].m_backend.fpclass = local_108.fpclass;
          pnVar16[nr].m_backend.prec_elem = local_108.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar18->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_160->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
      pnVar16 = (local_160->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pnVar16[nr].m_backend.data = local_108.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar16[nr].m_backend.data + 8) = local_108.data._M_elems._8_8_;
      puVar1 = (uint *)((long)&pnVar16[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_108.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(ulong *)((long)&pnVar16[nr].m_backend.data + 0x20) =
           CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_);
      pnVar16[nr].m_backend.exp = local_108.exp;
      pnVar16[nr].m_backend.neg = local_108.neg;
      pnVar16[nr].m_backend.fpclass = local_108.fpclass;
      pnVar16[nr].m_backend.prec_elem = local_108.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_160->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)pcVar14,0.0);
    if (!polish) {
      if (((local_108.fpclass == cpp_dec_float_NaN) ||
          (pnVar16 = (pVVar18->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          pnVar16[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&pnVar16[nr].m_backend), iVar12 < 1)) {
        pcVar14 = &(local_160->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_c8.fpclass = cpp_dec_float_finite;
        local_c8.prec_elem = 10;
        local_c8.data._M_elems[0] = 0;
        local_c8.data._M_elems[1] = 0;
        local_c8.data._M_elems[2] = 0;
        local_c8.data._M_elems[3] = 0;
        local_c8.data._M_elems[4] = 0;
        local_c8.data._M_elems[5] = 0;
        local_c8.data._M_elems._24_5_ = 0;
        local_c8.data._M_elems[7]._1_3_ = 0;
        local_c8.data._M_elems._32_5_ = 0;
        local_c8.data._M_elems[9]._1_3_ = 0;
        local_c8.exp = 0;
        local_c8.neg = false;
        if (&local_c8 != pcVar14) {
          uVar11 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
          local_c8.data._M_elems._32_5_ = SUB85(uVar11,0);
          local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
          local_c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
          local_c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
          local_c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
          uVar11 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
          local_c8.data._M_elems._24_5_ = SUB85(uVar11,0);
          local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
          local_c8.exp = pcVar14->exp;
          local_c8.neg = pcVar14->neg;
          local_c8.fpclass = pcVar14->fpclass;
          local_c8.prec_elem = pcVar14->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_c8,&local_108);
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      else {
        pcVar14 = &(pVVar18->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_c8.fpclass = cpp_dec_float_finite;
        local_c8.prec_elem = 10;
        local_c8.data._M_elems[0] = 0;
        local_c8.data._M_elems[1] = 0;
        local_c8.data._M_elems[2] = 0;
        local_c8.data._M_elems[3] = 0;
        local_c8.data._M_elems[4] = 0;
        local_c8.data._M_elems[5] = 0;
        local_c8.data._M_elems._24_5_ = 0;
        local_c8.data._M_elems[7]._1_3_ = 0;
        local_c8.data._M_elems._32_5_ = 0;
        local_c8.data._M_elems[9]._1_3_ = 0;
        local_c8.exp = 0;
        local_c8.neg = false;
        if (&local_c8 == pcVar14) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_c8,&local_108);
          if (local_c8.data._M_elems[0] != 0 || local_c8.fpclass != cpp_dec_float_finite) {
            local_c8.neg = (bool)(local_c8.neg ^ 1);
          }
        }
        else {
          local_c8.data._M_elems._32_5_ = local_108.data._M_elems._32_5_;
          local_c8.data._M_elems[9]._1_3_ = local_108.data._M_elems[9]._1_3_;
          local_c8.data._M_elems[4] = local_108.data._M_elems[4];
          local_c8.data._M_elems[5] = local_108.data._M_elems[5];
          local_c8.data._M_elems._24_5_ = local_108.data._M_elems._24_5_;
          local_c8.data._M_elems[7]._1_3_ = local_108.data._M_elems[7]._1_3_;
          local_c8.data._M_elems[0] = local_108.data._M_elems[0];
          local_c8.data._M_elems[1] = local_108.data._M_elems[1];
          local_c8.data._M_elems[2] = local_108.data._M_elems[2];
          local_c8.data._M_elems[3] = local_108.data._M_elems[3];
          local_c8.exp = local_108.exp;
          local_c8.neg = local_108.neg;
          local_c8.fpclass = local_108.fpclass;
          local_c8.prec_elem = local_108.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_c8,pcVar14);
        }
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pSVar2->theShift).m_backend,&local_c8);
      pnVar16 = (local_160->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar16[nr].m_backend.data + 0x20) =
           CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar16[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_108.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(undefined8 *)&pnVar16[nr].m_backend.data = local_108.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar16[nr].m_backend.data + 8) = local_108.data._M_elems._8_8_;
      pnVar16[nr].m_backend.exp = local_108.exp;
      pnVar16[nr].m_backend.neg = local_108.neg;
      pnVar16[nr].m_backend.fpclass = local_108.fpclass;
      pnVar16[nr].m_backend.prec_elem = local_108.prec_elem;
      pnVar6 = (pVVar18->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar6[nr].m_backend.data + 0x20) =
           CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_108.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(undefined8 *)&pnVar6[nr].m_backend.data = local_108.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[nr].m_backend.data + 8) = local_108.data._M_elems._8_8_;
      pnVar6[nr].m_backend.exp = pnVar16[nr].m_backend.exp;
      pnVar6[nr].m_backend.neg = pnVar16[nr].m_backend.neg;
      iVar8 = pnVar16[nr].m_backend.prec_elem;
      pnVar6[nr].m_backend.fpclass = pnVar16[nr].m_backend.fpclass;
      pnVar6[nr].m_backend.prec_elem = iVar8;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}